

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::dotSI8x16toI16x8Add
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Type *pTVar1;
  Literal *val;
  Literal *this_00;
  long lVar2;
  Literal *this_01;
  undefined1 local_188 [8];
  LaneArray<8> tempLanes;
  LaneArray<4> dest;
  Literal temp;
  
  pTVar1 = &dest._M_elems[3].type;
  dotSI8x16toI16x8((Literal *)pTVar1,this,left);
  this_01 = (Literal *)local_188;
  getLanes<short,8>((LaneArray<8> *)this_01,(wasm *)pTVar1,val);
  dest._M_elems[3].field_0.i64 = 0;
  dest._M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
  dest._M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
  dest._M_elems[2].type.id = 0;
  dest._M_elems[1].type.id = 0;
  dest._M_elems[2].field_0.i64 = 0;
  dest._M_elems[1].field_0.i64 = 0;
  dest._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  dest._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  dest._M_elems[0].type.id = 0;
  tempLanes._M_elems[7].type.id = 0;
  dest._M_elems[0].field_0.i64 = 0;
  lVar2 = 0;
  pTVar1 = &temp.type;
  do {
    add((Literal *)pTVar1,this_01,this_01 + 1);
    this_00 = (Literal *)((long)dest._M_elems + lVar2 + -8);
    if (this_00 != (Literal *)pTVar1) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)pTVar1);
    }
    ~Literal((Literal *)pTVar1);
    lVar2 = lVar2 + 0x18;
    this_01 = this_01 + 2;
  } while (lVar2 != 0x60);
  Literal((Literal *)&temp.type,(LaneArray<4> *)&tempLanes._M_elems[7].type);
  addI32x4(__return_storage_ptr__,(Literal *)&temp.type,right);
  ~Literal((Literal *)&temp.type);
  lVar2 = 0x48;
  do {
    ~Literal((Literal *)((long)dest._M_elems + lVar2 + -8));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  lVar2 = 0xa8;
  do {
    ~Literal((Literal *)(local_188 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  ~Literal((Literal *)&dest._M_elems[3].type);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::dotSI8x16toI16x8Add(const Literal& left,
                                     const Literal& right) const {
  auto temp = dotSI8x16toI16x8(left);

  auto tempLanes = temp.getLanesSI16x8();
  LaneArray<4> dest;
  // TODO: the index on dest may be wrong, see
  //       https://github.com/WebAssembly/relaxed-simd/issues/162
  for (size_t i = 0; i < 4; i++) {
    dest[i] = tempLanes[i * 2].add(tempLanes[i * 2 + 1]);
  }

  return Literal(dest).addI32x4(right);
}